

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O0

size_type __thiscall
std::experimental::detail::
dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,2ul>
::operator()(dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,2ul>
             *this,dimensions<18446744073709551615UL,_18446744073709551615UL> d0,
            dimensions<18446744073709551615UL,_18446744073709551615UL> d1,
            dimensions<18446744073709551615UL,_18446744073709551615UL> d2)

{
  dimensions<18446744073709551615UL,_18446744073709551615UL> d1_00;
  dimensions<18446744073709551615UL,_18446744073709551615UL> d0_00;
  value_type d;
  value_type s;
  value_type p;
  unsigned_long uVar1;
  size_type v1;
  dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,2ul,2ul>
  local_33;
  span_by_value local_32;
  multiplies_by_value local_31;
  dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,2ul>
  *local_30;
  dims_ternary_reduction<std::experimental::detail::span_by_value,_std::experimental::detail::multiplies_by_value,_std::experimental::detail::static_sentinel<1UL>,_1UL,_2UL>
  *this_local;
  dimensions<18446744073709551615UL,_18446744073709551615UL> d1_local;
  dimensions<18446744073709551615UL,_18446744073709551615UL> d0_local;
  
  d1_local.dynamic_dims_._M_elems[0] = d1.dynamic_dims_._M_elems[1];
  this_local = d1.dynamic_dims_._M_elems[0];
  d1_local.dynamic_dims_._M_elems[1] = d0.dynamic_dims_._M_elems[0];
  local_30 = this;
  d = dimensions<18446744073709551615UL,_18446744073709551615UL>::operator[]<unsigned_long>
                ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                 (d1_local.dynamic_dims_._M_elems + 1),1);
  s = dimensions<18446744073709551615UL,_18446744073709551615UL>::operator[]<unsigned_long>
                ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)&this_local,1);
  p = dimensions<18446744073709551615UL,_18446744073709551615UL>::operator[]<unsigned_long>(&d2,1);
  uVar1 = span_by_value::operator()(&local_32,d,s,p);
  d0_00.dynamic_dims_._M_elems[1] = d0.dynamic_dims_._M_elems[1];
  d0_00.dynamic_dims_._M_elems[0] = d1_local.dynamic_dims_._M_elems[1];
  d1_00.dynamic_dims_._M_elems[1] = d1_local.dynamic_dims_._M_elems[0];
  d1_00.dynamic_dims_._M_elems[0] = (unsigned_long)this_local;
  v1 = dims_ternary_reduction<std::experimental::detail::span_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,2ul,2ul>
       ::operator()(&local_33,d0_00,d1_00,d2);
  uVar1 = multiplies_by_value::operator()(&local_31,uVar1,v1);
  return uVar1;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
      , dimensions<Dims1...> d1
      , dimensions<Dims2...> d2
        ) const noexcept
    {
        static_assert(
               dimensions<Dims0...>::rank() == dimensions<Dims1...>::rank()
            && dimensions<Dims0...>::rank() == dimensions<Dims2...>::rank()
          , "Arguments to ternary reduction have unequal rank"
        );
        static_assert(
               dimensions<Dims0...>::rank() == Size 
            || dimensions<Dims1...>::rank() == Size 
            || dimensions<Dims2...>::rank() == Size 
          , "Size not equal to rank of arguments"
        );

        return Reduction()(
            Op()(d0[Idx], d1[Idx], d2[Idx])
          , dims_ternary_reduction<Op, Reduction, Sentinel, Idx + 1, Size>()
                (std::move(d0), std::move(d1), std::move(d2))
        );
    }